

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O2

WRAP_CHAR * make_absolute_path(char *tail)

{
  _Bool _Var1;
  char *pcVar2;
  ALLEGRO_PATH *head;
  ALLEGRO_PATH *tail_00;
  int *piVar3;
  char cwd [4096];
  
  pcVar2 = getcwd(cwd,0x1000);
  if (pcVar2 == (char *)0x0) {
    _Var1 = _al_trace_prefix("fshook",2,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/fshook_stdio.c"
                             ,0xbb,"make_absolute_path_inner");
    if (_Var1) {
      _al_trace_suffix("Unable to get current working directory.\n");
    }
    piVar3 = __errno_location();
    al_set_errno(*piVar3);
LAB_0015a539:
    head = (ALLEGRO_PATH *)0x0;
  }
  else {
    head = al_create_path_for_directory(cwd);
    if (head == (ALLEGRO_PATH *)0x0) goto LAB_0015a539;
    tail_00 = al_create_path(tail);
    if (tail_00 != (ALLEGRO_PATH *)0x0) {
      _Var1 = al_rebase_path(head,tail_00);
      if (_Var1) {
        al_make_path_canonical(tail_00);
      }
      pcVar2 = al_path_cstr(tail_00,'/');
      pcVar2 = strdup(pcVar2);
      goto LAB_0015a541;
    }
  }
  tail_00 = (ALLEGRO_PATH *)0x0;
  pcVar2 = (char *)0x0;
LAB_0015a541:
  al_destroy_path(head);
  al_destroy_path(tail_00);
  return pcVar2;
}

Assistant:

static WRAP_CHAR *make_absolute_path(const char *tail)
{
   WRAP_CHAR *abs_path = NULL;
#ifdef ALLEGRO_WINDOWS
   wchar_t *wtail = _al_win_utf8_to_utf16(tail);
   if (wtail) {
      abs_path = make_absolute_path_inner(wtail);
      al_free(wtail);
   }
#else
   abs_path = make_absolute_path_inner(tail);
#endif
   return abs_path;
}